

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall
Utf8Decode_IllegalCodePositions_Test::TestBody(Utf8Decode_IllegalCodePositions_Test *this)

{
  bytes *input;
  bytes *input_00;
  bytes *input_01;
  bytes *input_02;
  bytes *input_03;
  bytes *input_04;
  bytes *input_05;
  bytes *input_06;
  bytes *input_07;
  bytes *input_08;
  bytes *input_09;
  bytes *input_10;
  bytes *input_11;
  bytes *input_12;
  bytes *input_13;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  allocator_type local_209;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  undefined4 local_1f0;
  undefined2 local_1ec;
  cpstring local_1e8;
  cpstring local_1c8;
  cpstring local_1a8;
  cpstring local_188;
  cpstring local_168;
  cpstring local_148;
  cpstring local_128;
  cpstring local_108;
  cpstring local_e8;
  cpstring local_c8;
  cpstring local_a8;
  cpstring local_88;
  cpstring local_68;
  cpstring local_48;
  cpstring local_28;
  
  local_1f0._0_3_ = 0x80a0ed;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_28,&local_208,input);
  std::__cxx11::u32string::~u32string((u32string *)&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0._0_3_ = 0xbfaded;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_00,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_48,&local_208,input_00);
  std::__cxx11::u32string::~u32string((u32string *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0._0_3_ = 0x80aeed;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_01,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_68,&local_208,input_01);
  std::__cxx11::u32string::~u32string((u32string *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0._0_3_ = 0xbfafed;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_02,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_88,&local_208,input_02);
  std::__cxx11::u32string::~u32string((u32string *)&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0._0_3_ = 0x80b0ed;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_03,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_a8,&local_208,input_03);
  std::__cxx11::u32string::~u32string((u32string *)&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0._0_3_ = 0x80beed;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_04,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_c8,&local_208,input_04);
  std::__cxx11::u32string::~u32string((u32string *)&local_c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = CONCAT13(local_1f0._3_1_,0xbfbfed);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_05,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_e8,&local_208,input_05);
  std::__cxx11::u32string::~u32string((u32string *)&local_e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xed80a0ed;
  local_1ec = 0x80b0;
  __l_06._M_len = 6;
  __l_06._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_06,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_108,&local_208,input_06);
  std::__cxx11::u32string::~u32string((u32string *)&local_108);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xed80a0ed;
  local_1ec = 0xbfbf;
  __l_07._M_len = 6;
  __l_07._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_07,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_128,&local_208,input_07);
  std::__cxx11::u32string::~u32string((u32string *)&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xedbfaded;
  local_1ec = 0x80b0;
  __l_08._M_len = 6;
  __l_08._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_08,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_148,&local_208,input_08);
  std::__cxx11::u32string::~u32string((u32string *)&local_148);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xedbfaded;
  local_1ec = 0xbfbf;
  __l_09._M_len = 6;
  __l_09._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_09,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_168,&local_208,input_09);
  std::__cxx11::u32string::~u32string((u32string *)&local_168);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xed80aeed;
  local_1ec = 0x80b0;
  __l_10._M_len = 6;
  __l_10._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_10,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_188,&local_208,input_10);
  std::__cxx11::u32string::~u32string((u32string *)&local_188);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xed80aeed;
  local_1ec = 0xbfbf;
  __l_11._M_len = 6;
  __l_11._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_11,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_1a8,&local_208,input_11);
  std::__cxx11::u32string::~u32string((u32string *)&local_1a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xedbfafed;
  local_1ec = 0x80b0;
  __l_12._M_len = 6;
  __l_12._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_12,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_1c8,&local_208,input_12);
  std::__cxx11::u32string::~u32string((u32string *)&local_1c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  local_1f0 = 0xedbfafed;
  local_1ec = 0xbfbf;
  __l_13._M_len = 6;
  __l_13._M_array = (iterator)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,__l_13,&local_209);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_1e8,&local_208,input_13);
  std::__cxx11::u32string::~u32string((u32string *)&local_1e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
  return;
}

Assistant:

TEST_F (Utf8Decode, IllegalCodePositions) {
    // Single UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80})); // U+D800
    decode_bad (bytes ({0xED, 0xAD, 0xBF})); // U+DB7F
    decode_bad (bytes ({0xED, 0xAE, 0x80})); // U+DB80
    decode_bad (bytes ({0xED, 0xAF, 0xBF})); // U+DBFF
    decode_bad (bytes ({0xED, 0xB0, 0x80})); // U+DC00
    decode_bad (bytes ({0xED, 0xBE, 0x80})); // U+DF80
    decode_bad (bytes ({0xED, 0xBF, 0xBF})); // U+DFFF

    // Paired UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xB0, 0x80})); // U+D800 U+DC00
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xBF, 0xBF})); // U+D800 U+DFFF
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xB0, 0x80})); // U+DB7F U+DC00
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xBF, 0xBF})); // U+DB7F U+DFFF
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xB0, 0x80})); // U+DB80 U+DC00
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xBF, 0xBF})); // U+DB80 U+DFFF
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xB0, 0x80})); // U+DBFF U+DC00
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xBF, 0xBF})); // U+DBFF U+DFFF
}